

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O1

void deqp::gles3::Functional::DepthStencilCaseUtil::render
               (QuadRenderer *renderer,RenderCommand *command,int viewportX,int viewportY)

{
  float fVar1;
  undefined8 uVar2;
  GLenum GVar3;
  long lVar4;
  bool bVar5;
  Quad local_d0;
  
  if ((command->params).stencilTestEnabled == true) {
    glwEnable(0xb90);
    lVar4 = -0x1c;
    do {
      GVar3 = (lVar4 == 0) + 0x404;
      glwStencilFuncSeparate
                (GVar3,*(GLenum *)((long)&(command->params).stencil[1].function + lVar4),
                 *(GLint *)((long)&(command->params).stencil[1].reference + lVar4),
                 *(GLuint *)((long)&(command->params).stencil[1].compareMask + lVar4));
      glwStencilOpSeparate
                (GVar3,*(GLenum *)((long)&(command->params).stencil[1].stencilFailOp + lVar4),
                 *(GLenum *)((long)&(command->params).stencil[1].depthFailOp + lVar4),
                 *(GLenum *)((long)&(command->params).stencil[1].depthPassOp + lVar4));
      glwStencilMaskSeparate
                (GVar3,*(GLuint *)((long)&(command->params).stencil[1].writeMask + lVar4));
      lVar4 = lVar4 + 0x1c;
    } while (lVar4 == 0);
  }
  else {
    glwDisable(0xb90);
  }
  if ((command->params).depthTestEnabled == true) {
    glwEnable(0xb71);
    glwDepthFunc((command->params).depthFunc);
    glwDepthMask((command->params).depthWriteMask);
  }
  else {
    glwDisable(0xb71);
  }
  glwColorMask((command->colorMask).m_data[0],(command->colorMask).m_data[1],
               (command->colorMask).m_data[2],(command->colorMask).m_data[3]);
  glwViewport(viewportX + (command->rect).left,viewportY + (command->rect).bottom,
              (command->rect).width,(command->rect).height);
  local_d0.posA.m_data[0] = -1.0;
  local_d0.posA.m_data[1] = -1.0;
  local_d0.posB.m_data = (float  [2])&DAT_3f8000003f800000;
  memset(local_d0.color,0,0x90);
  bVar5 = (command->params).visibleFace != FACETYPE_FRONT;
  local_d0.posB.m_data[0] = -1.0;
  if (!bVar5) {
    local_d0.posB.m_data[0] = 1.0;
  }
  local_d0.posA.m_data[1] = -1.0;
  local_d0.posA.m_data[0] = (float)((uint)bVar5 * -0x80000000 + -0x40800000);
  local_d0.posB.m_data[1] = 1.0;
  lVar4 = 0x10;
  do {
    uVar2 = *(undefined8 *)((command->color).m_data + 2);
    *(undefined8 *)((long)local_d0.posA.m_data + lVar4) = *(undefined8 *)(command->color).m_data;
    *(undefined8 *)((long)local_d0.posB.m_data + lVar4) = uVar2;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x50);
  fVar1 = (command->params).depth;
  lVar4 = 0x90;
  do {
    *(float *)((long)local_d0.posA.m_data + lVar4) = fVar1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xa0);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(renderer,&local_d0);
  GVar3 = glwGetError();
  glu::checkError(GVar3,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDepthStencilTests.cpp"
                  ,0x1de);
  return;
}

Assistant:

void render (gls::FragmentOpUtil::QuadRenderer& renderer, const RenderCommand& command, int viewportX, int viewportY)
{
	if (command.params.stencilTestEnabled)
	{
		glEnable(GL_STENCIL_TEST);

		for (int face = 0; face < rr::FACETYPE_LAST; face++)
		{
			deUint32				glFace	= face == rr::FACETYPE_BACK ? GL_BACK : GL_FRONT;
			const StencilParams&	sParams	= command.params.stencil[face];

			glStencilFuncSeparate(glFace, sParams.function, sParams.reference, sParams.compareMask);
			glStencilOpSeparate(glFace, sParams.stencilFailOp, sParams.depthFailOp, sParams.depthPassOp);
			glStencilMaskSeparate(glFace, sParams.writeMask);
		}
	}
	else
		glDisable(GL_STENCIL_TEST);

	if (command.params.depthTestEnabled)
	{
		glEnable(GL_DEPTH_TEST);
		glDepthFunc(command.params.depthFunc);
		glDepthMask(command.params.depthWriteMask ? GL_TRUE : GL_FALSE);
	}
	else
		glDisable(GL_DEPTH_TEST);

	glColorMask(command.colorMask[0] ? GL_TRUE : GL_FALSE,
				command.colorMask[1] ? GL_TRUE : GL_FALSE,
				command.colorMask[2] ? GL_TRUE : GL_FALSE,
				command.colorMask[3] ? GL_TRUE : GL_FALSE);
	glViewport(command.rect.left+viewportX, command.rect.bottom+viewportY, command.rect.width, command.rect.height);

	gls::FragmentOpUtil::Quad quad;

	bool isFrontFacing = command.params.visibleFace == rr::FACETYPE_FRONT;
	quad.posA = Vec2(isFrontFacing ? -1.0f :  1.0f, -1.0f);
	quad.posB = Vec2(isFrontFacing ?  1.0f : -1.0f,  1.0f);

	std::fill(DE_ARRAY_BEGIN(quad.color), DE_ARRAY_END(quad.color), command.color);
	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), command.params.depth);

	renderer.render(quad);
	GLU_CHECK();
}